

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

int SUNLinSolInitialize_SPBCGS(SUNLinearSolver S)

{
  SUNLinearSolver S_local;
  
  if (S == (SUNLinearSolver)0x0) {
    S_local._4_4_ = -1;
  }
  else {
    if (((*(int *)((long)S->content + 4) != 1) && (*(int *)((long)S->content + 4) != 2)) &&
       (*(int *)((long)S->content + 4) != 3)) {
      *(undefined4 *)((long)S->content + 4) = 0;
    }
    if (*S->content < 1) {
      *(undefined4 *)S->content = 5;
    }
    *(undefined8 *)((long)S->content + 0x18) = 0;
    S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x18);
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolInitialize_SPBCGS(SUNLinearSolver S)
{
  /* ensure valid options */
  if (S == NULL) return(SUNLS_MEM_NULL);  
  if ( (PRETYPE(S) != PREC_LEFT) && 
       (PRETYPE(S) != PREC_RIGHT) && 
       (PRETYPE(S) != PREC_BOTH) )
    PRETYPE(S) = PREC_NONE;
  if (SPBCGS_CONTENT(S)->maxl <= 0) 
    SPBCGS_CONTENT(S)->maxl = SUNSPBCGS_MAXL_DEFAULT;

  /* no additional memory to allocate */
  
  /* return with success */
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}